

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmapbuilder.cpp
# Opt level: O1

void __thiscall BitmapResult::writeMonoAlphaRGBFull(BitmapResult *this,FILE *file,png_bytepp rows)

{
  png_byte *ppVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ushort local_42;
  ulong local_40;
  png_bytepp local_38;
  
  if (this->m_height != 0) {
    local_40 = 0;
    local_38 = rows;
    do {
      if (this->m_width != 0) {
        ppVar1 = local_38[local_40];
        uVar3 = 0;
        uVar4 = 0;
        do {
          uVar2 = (ppVar1[uVar3] & 0xf8) * 0x80 + (ppVar1[(ulong)uVar3 + 1] & 0xf8) * 4;
          local_42 = (ushort)((ushort)(ppVar1[(ulong)uVar3 + 3] == 0xff) << 0xf | uVar2) >> 8 |
                     (ppVar1[(ulong)uVar3 + 2] >> 3 | uVar2) << 8;
          fwrite(&local_42,2,1,(FILE *)file);
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 + 4;
        } while (uVar4 < this->m_width);
      }
      local_40 = local_40 + 1;
    } while (local_40 < this->m_height);
  }
  return;
}

Assistant:

void BitmapResult::writeMonoAlphaRGBFull(FILE *file, png_bytepp rows){
    for(uint32_t y=0;y<m_height;y++){
        png_bytep row = rows[y];
        for(uint32_t x=0;x<m_width;x++){
            png_bytep p = &row[x*4];
            uint16_t pixel = 0;
            //What the fuck! Why is the endianness flipped? Honestly, just shoot me at this point
            pixel |= ((uint16_t)(p[0]/8)) <<10; //r
            pixel |= ((uint16_t)(p[1]/8)) <<5; //g
            pixel |= ((uint16_t)(p[2]/8)) <<0; //b
            pixel |= ((uint16_t)(p[3]/255)) <<15; //a
            pixel = ((pixel&0xff00)>>8)|((pixel&0x00ff)<<8); //flip endianness
            fwrite(&pixel,2,1,file);
        }
    }
}